

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O3

LLVMValueRefOpaque ** __thiscall
SmallDenseMap<unsigned_int,_LLVMValueRefOpaque_*,_SmallDenseMapUnsignedHasher,_128U>::find
          (SmallDenseMap<unsigned_int,_LLVMValueRefOpaque_*,_SmallDenseMapUnsignedHasher,_128U>
           *this,uint *key)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  
  uVar2 = this->bucketCount;
  uVar3 = uVar2 - 1;
  if (uVar2 != 0) {
    uVar5 = *key * -0x61c88647;
    iVar4 = 0;
    do {
      uVar5 = uVar5 & uVar3;
      uVar1 = this->data[uVar5].key;
      if (uVar1 == 0) {
        return (LLVMValueRefOpaque **)0x0;
      }
      if (uVar1 == *key) {
        return &this->data[uVar5].value;
      }
      uVar5 = uVar5 + iVar4 + 1;
      iVar4 = iVar4 + 1;
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  return (LLVMValueRefOpaque **)0x0;
}

Assistant:

Value* find(const Key& key) const
	{
		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = Hasher()(key) & bucketMask;

		for(unsigned i = 0; i < bucketCount; i++)
		{
			Node &item = data[bucket];

			if(item.key == Key())
				return NULL;

			if(item.key == key)
				return &item.value;

			// Quadratic probing
			bucket = (bucket + i + 1) & bucketMask;
		}

		return NULL;
	}